

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::AddCMP0018Flags
          (cmLocalGenerator *this,string *flags,cmGeneratorTarget *target,string *lang,
          string *config)

{
  bool bVar1;
  TargetType targetType;
  TargetType TVar2;
  TargetType TVar3;
  allocator local_59;
  string *local_58;
  string local_50;
  
  local_58 = config;
  targetType = cmGeneratorTarget::GetType(target);
  TVar3 = targetType & ~STATIC_LIBRARY;
  bVar1 = GetShouldUseOldFlags(this,TVar3 == SHARED_LIBRARY,lang);
  if (bVar1) {
    AddSharedFlags(this,flags,lang,TVar3 == SHARED_LIBRARY);
    return;
  }
  TVar2 = cmGeneratorTarget::GetType(target);
  if (TVar2 == OBJECT_LIBRARY) {
    std::__cxx11::string::string((string *)&local_50,"POSITION_INDEPENDENT_CODE",&local_59);
    bVar1 = cmGeneratorTarget::GetPropertyAsBool(target,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (bVar1) {
      AddPositionIndependentFlags(this,flags,lang,targetType);
    }
  }
  else {
    std::__cxx11::string::string((string *)&local_50,"POSITION_INDEPENDENT_CODE",&local_59);
    bVar1 = cmGeneratorTarget::GetLinkInterfaceDependentBoolProperty(target,&local_50,local_58);
    std::__cxx11::string::~string((string *)&local_50);
    if (bVar1) {
      AddPositionIndependentFlags(this,flags,lang,targetType);
    }
    if (TVar3 == SHARED_LIBRARY) {
      AppendFeatureOptions(this,flags,lang,"DLL");
    }
  }
  return;
}

Assistant:

void cmLocalGenerator::AddCMP0018Flags(std::string& flags,
                                       cmGeneratorTarget const* target,
                                       std::string const& lang,
                                       const std::string& config)
{
  int targetType = target->GetType();

  bool shared = ((targetType == cmStateEnums::SHARED_LIBRARY) ||
                 (targetType == cmStateEnums::MODULE_LIBRARY));

  if (this->GetShouldUseOldFlags(shared, lang)) {
    this->AddSharedFlags(flags, lang, shared);
  } else {
    if (target->GetType() == cmStateEnums::OBJECT_LIBRARY) {
      if (target->GetPropertyAsBool("POSITION_INDEPENDENT_CODE")) {
        this->AddPositionIndependentFlags(flags, lang, targetType);
      }
      return;
    }

    if (target->GetLinkInterfaceDependentBoolProperty(
          "POSITION_INDEPENDENT_CODE", config)) {
      this->AddPositionIndependentFlags(flags, lang, targetType);
    }
    if (shared) {
      this->AppendFeatureOptions(flags, lang, "DLL");
    }
  }
}